

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SwapExtension
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other,int number)

{
  Arena *other_arena_00;
  KeyValue *other_extension;
  Extension *other_extension_00;
  Arena *pAVar1;
  Extension *temp_ext;
  undefined1 local_60 [8];
  ExtensionSet temp;
  Extension *other_ext;
  Extension *this_ext;
  Arena *other_arena;
  Arena *arena;
  int number_local;
  ExtensionSet *other_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  if (this != other) {
    pAVar1 = this->arena_;
    other_arena_00 = other->arena_;
    if (pAVar1 == other_arena_00) {
      UnsafeShallowSwapExtension(this,other,number);
    }
    else {
      other_extension = (KeyValue *)FindOrNull(this,number);
      temp.map_.flat = (KeyValue *)FindOrNull(other,number);
      if (other_extension != temp.map_.flat) {
        if ((other_extension == (KeyValue *)0x0) || (temp.map_.flat == (KeyValue *)0x0)) {
          if (other_extension == (KeyValue *)0x0) {
            InternalExtensionMergeFrom
                      (this,extendee,number,(Extension *)temp.map_.flat,other_arena_00);
            if (other_arena_00 == (Arena *)0x0) {
              Extension::Free((Extension *)temp.map_.flat);
            }
            Erase(other,number);
          }
          else {
            InternalExtensionMergeFrom(other,extendee,number,(Extension *)other_extension,pAVar1);
            if (pAVar1 == (Arena *)0x0) {
              Extension::Free((Extension *)other_extension);
            }
            Erase(this,number);
          }
        }
        else {
          ExtensionSet((ExtensionSet *)local_60);
          InternalExtensionMergeFrom
                    ((ExtensionSet *)local_60,extendee,number,(Extension *)temp.map_.flat,
                     other_arena_00);
          other_extension_00 = FindOrNull((ExtensionSet *)local_60,number);
          Extension::Clear((Extension *)temp.map_.flat);
          InternalExtensionMergeFrom(other,extendee,number,(Extension *)other_extension,pAVar1);
          Extension::Clear((Extension *)other_extension);
          pAVar1 = GetArena((ExtensionSet *)local_60);
          InternalExtensionMergeFrom(this,extendee,number,other_extension_00,pAVar1);
          ~ExtensionSet((ExtensionSet *)local_60);
        }
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::SwapExtension(const MessageLite* extendee,
                                 ExtensionSet* other, int number) {
  if (this == other) return;

  Arena* const arena = arena_;
  Arena* const other_arena = other->arena_;
  if (arena == other_arena) {
    UnsafeShallowSwapExtension(other, number);
    return;
  }

  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == other_ext) return;

  if (this_ext != nullptr && other_ext != nullptr) {
    // TODO: We could further optimize these cases,
    // especially avoid creation of ExtensionSet, and move MergeFrom logic
    // into Extensions itself (which takes arena as an argument).
    // We do it this way to reuse the copy-across-arenas logic already
    // implemented in ExtensionSet's MergeFrom.
    ExtensionSet temp;
    temp.InternalExtensionMergeFrom(extendee, number, *other_ext, other_arena);
    Extension* temp_ext = temp.FindOrNull(number);

    other_ext->Clear();
    other->InternalExtensionMergeFrom(extendee, number, *this_ext, arena);
    this_ext->Clear();
    InternalExtensionMergeFrom(extendee, number, *temp_ext, temp.GetArena());
  } else if (this_ext == nullptr) {
    InternalExtensionMergeFrom(extendee, number, *other_ext, other_arena);
    if (other_arena == nullptr) other_ext->Free();
    other->Erase(number);
  } else {
    other->InternalExtensionMergeFrom(extendee, number, *this_ext, arena);
    if (arena == nullptr) this_ext->Free();
    Erase(number);
  }
}